

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

bool __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_node
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          *node_queue,uint *end_node,task_pool *pTask_pool)

{
  long lVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  uint a;
  uint uVar5;
  const_reference pvVar6;
  vq_node *pvVar7;
  VectorInfo *pVVar8;
  row_vec *prVar9;
  float *pfVar10;
  vec<6U,_float> *pvVar11;
  bool *pbVar12;
  double *pdVar13;
  VectorInfo *pVVar14;
  vq_node *this_00;
  task_pool *in_RCX;
  uint *in_RDX;
  long *in_RDI;
  float fVar15;
  float fVar16;
  float fVar17;
  vq_node *right_child_node;
  vq_node *left_child_node;
  float total_variance;
  double right_dist2;
  double left_dist2;
  VectorInfo *vectorInfo_2;
  uint i_6;
  VectorInfo *vectorInfo_1;
  uint i_5;
  uint task;
  distance_comparison_task_params params;
  double right_ttsum;
  double left_ttsum;
  vec<6U,_float> new_right_child_1;
  vec<6U,_float> new_left_child_1;
  uint total_loops;
  uint cMaxLoops;
  float right_variance;
  float left_variance;
  float prev_total_variance;
  uint right_info_index;
  uint left_info_index;
  uint64 right_weight;
  uint64 left_weight;
  double t;
  float weight;
  VectorInfo *vectorInfo;
  uint i_4;
  double right_weight_1;
  double left_weight_1;
  vec<6U,_float> new_right_child;
  vec<6U,_float> new_left_child;
  uint j;
  double sum;
  uint i_3;
  double max_sum;
  vec<6U,_float> x_2;
  uint iter;
  vec<6U,_float> axis;
  uint y_1;
  uint x_1;
  float divider;
  uint y;
  uint x;
  vec<6U,_float> w;
  vec<6U,_float> *v_2;
  uint i_2;
  matrix<6U,_6U,_float> covar;
  uint N;
  vec<6U,_float> right_child;
  vec<6U,_float> left_child;
  double dist_1;
  vec<6U,_float> *v_1;
  uint i_1;
  double opposite_dist;
  vec<6U,_float> opposite;
  double dist;
  vec<6U,_float> *v;
  uint i;
  double furthest_dist;
  vec<6U,_float> furthest;
  uint num_tasks;
  uint num_blocks;
  vq_node *parent_node;
  vq_node *in_stack_fffffffffffffad8;
  vq_node *in_stack_fffffffffffffae0;
  vec<6U,_float> *in_stack_fffffffffffffae8;
  matrix<6U,_6U,_float> *in_stack_fffffffffffffaf0;
  float in_stack_fffffffffffffaf8;
  float in_stack_fffffffffffffafc;
  float in_stack_fffffffffffffb00;
  float in_stack_fffffffffffffb04;
  undefined4 in_stack_fffffffffffffb10;
  float in_stack_fffffffffffffb14;
  float in_stack_fffffffffffffb18;
  float in_stack_fffffffffffffb1c;
  float local_4c4;
  double local_4a0;
  float local_480;
  uint local_43c;
  NodeInfo local_3e4;
  NodeInfo local_3dc;
  float local_3d4;
  double local_3d0;
  double local_3c8;
  VectorInfo *local_3c0;
  uint local_3b4;
  VectorInfo *local_3b0;
  uint local_3a4;
  code *local_3a0;
  undefined8 local_398;
  uint local_38c;
  vec<6U,_float> *local_388;
  vec<6U,_float> *local_380;
  uint local_378;
  uint local_374;
  uint local_370;
  double local_368;
  double local_360;
  vec<6U,_float> local_354;
  vec<6U,_float> local_33c;
  uint local_324;
  undefined4 local_320;
  float local_31c;
  float local_318;
  float local_314;
  uint local_310;
  uint local_30c;
  uint64 local_308;
  uint64 local_300;
  vec<6U,_float> local_2f8;
  vec<6U,_float> local_2e0;
  vec<6U,_float> local_2c8;
  double local_2b0;
  float local_2a4;
  VectorInfo *local_2a0;
  uint local_294;
  double local_290;
  double local_288;
  vec<6U,_float> local_27c;
  vec<6U,_float> local_264;
  uint local_24c;
  double local_248;
  uint local_23c;
  double local_238;
  vec<6U,_float> local_230;
  uint local_218;
  vec<6U,_float> local_214;
  uint local_1fc;
  uint local_1f8;
  float local_1f4;
  uint local_1f0;
  uint local_1ec;
  vec<6U,_float> local_1e8;
  vec<6U,_float> local_1d0;
  vec<6U,_float> *local_1b8;
  uint local_1b0;
  matrix<6U,_6U,_float> local_1ac;
  undefined4 local_11c;
  vec<6U,_float> local_100 [2];
  vec<6U,_float> local_d0;
  double local_b8;
  vec<6U,_float> *local_b0;
  uint local_a4;
  double local_a0;
  vec<6U,_float> local_98;
  double local_80;
  vec<6U,_float> *local_78;
  uint local_6c;
  double local_68;
  vec<6U,_float> local_60;
  uint local_48;
  uint local_44;
  NodeInfo local_40;
  NodeInfo local_38;
  vq_node *local_30;
  task_pool *local_28;
  uint *local_20;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  bVar4 = std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          ::empty((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                   *)0x2057d4);
  if (bVar4) {
    local_1 = false;
  }
  else {
    pvVar6 = std::
             priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
             ::top((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                    *)0x20580a);
    local_30 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                         ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                          (in_RDI + 0x11),pvVar6->m_index);
    if ((local_30->m_alternative & 1U) != 0) {
      local_30->m_alternative = false;
    }
    if ((local_30->m_variance <= 0.0) || (local_30->m_begin + 1 == local_30->m_end)) {
      local_1 = false;
    }
    else {
      std::
      priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
      ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
             *)in_stack_fffffffffffffaf0);
      if ((local_30->m_processed & 1U) == 0) {
        local_30->m_processed = true;
        a = local_30->m_end - local_30->m_begin >> 9;
        local_44 = a;
        if ((a < 2) || (local_28 == (task_pool *)0x0)) {
          local_43c = 1;
        }
        else {
          uVar5 = task_pool::get_num_threads(local_28);
          local_43c = math::minimum<unsigned_int>(a,uVar5 + 1);
        }
        local_48 = local_43c;
        vec<6U,_float>::vec(&in_stack_fffffffffffffae0->m_centroid,
                            (float)((ulong)in_stack_fffffffffffffad8 >> 0x20));
        local_68 = -1.0;
        for (local_6c = local_30->m_begin; local_6c < local_30->m_end; local_6c = local_6c + 1) {
          lVar1 = *in_RDI;
          pVVar8 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                             ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>
                               *)(in_RDI + 5),local_6c);
          local_78 = (vec<6U,_float> *)(lVar1 + (ulong)pVVar8->index * 0x18);
          fVar15 = vec<6U,_float>::squared_distance(local_78,&local_30->m_centroid);
          local_80 = (double)fVar15;
          if (local_68 < local_80) {
            local_68 = local_80;
            vec<6U,_float>::operator=(&local_60,local_78);
          }
        }
        vec<6U,_float>::vec(&local_98);
        local_a0 = -1.0;
        for (local_a4 = local_30->m_begin; local_a4 < local_30->m_end; local_a4 = local_a4 + 1) {
          lVar1 = *in_RDI;
          pVVar8 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                             ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>
                               *)(in_RDI + 5),local_a4);
          local_b0 = (vec<6U,_float> *)(lVar1 + (ulong)pVVar8->index * 0x18);
          fVar15 = vec<6U,_float>::squared_distance(local_b0,&local_60);
          local_b8 = (double)fVar15;
          if (local_a0 < local_b8) {
            local_a0 = local_b8;
            vec<6U,_float>::operator=(&local_98,local_b0);
          }
        }
        operator+((vec<6U,_float> *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                  in_stack_fffffffffffffaf0->m_rows);
        crnlib::operator*(in_stack_fffffffffffffae8,
                          (float)((ulong)in_stack_fffffffffffffae0 >> 0x20));
        operator+((vec<6U,_float> *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                  in_stack_fffffffffffffaf0->m_rows);
        crnlib::operator*(in_stack_fffffffffffffae8,
                          (float)((ulong)in_stack_fffffffffffffae0 >> 0x20));
        if (local_30->m_begin + 2 < local_30->m_end) {
          local_11c = 6;
          matrix<6U,_6U,_float>::matrix(in_stack_fffffffffffffaf0);
          matrix<6U,_6U,_float>::clear((matrix<6U,_6U,_float> *)in_stack_fffffffffffffae0);
          for (local_1b0 = local_30->m_begin; local_1b0 < local_30->m_end; local_1b0 = local_1b0 + 1
              ) {
            vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                      ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *)
                       (in_RDI + 5),local_1b0);
            crnlib::operator-((vec<6U,_float> *)
                              CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                              in_stack_fffffffffffffaf0->m_rows);
            local_1b8 = &local_1d0;
            vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                      ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *)
                       (in_RDI + 5),local_1b0);
            crnlib::operator*(in_stack_fffffffffffffae8,
                              (float)((ulong)in_stack_fffffffffffffae0 >> 0x20));
            for (local_1ec = 0; local_1ec < 6; local_1ec = local_1ec + 1) {
              for (local_1f0 = local_1ec; local_1f0 < 6; local_1f0 = local_1f0 + 1) {
                prVar9 = matrix<6U,_6U,_float>::operator[](&local_1ac,local_1ec);
                pfVar10 = vec<6U,_float>::operator[](prVar9,local_1f0);
                fVar15 = *pfVar10;
                fVar16 = vec<6U,_float>::operator[](local_1b8,local_1ec);
                fVar17 = vec<6U,_float>::operator[](&local_1e8,local_1f0);
                prVar9 = matrix<6U,_6U,_float>::operator[](&local_1ac,local_1ec);
                pfVar10 = vec<6U,_float>::operator[](prVar9,local_1f0);
                *pfVar10 = fVar15 + fVar16 * fVar17;
              }
            }
          }
          local_480 = (float)local_30->m_total_weight;
          local_1f4 = local_480;
          for (local_1f8 = 0; local_1f8 < 6; local_1f8 = local_1f8 + 1) {
            for (local_1fc = local_1f8; fVar15 = local_1f4, local_1fc < 6; local_1fc = local_1fc + 1
                ) {
              prVar9 = matrix<6U,_6U,_float>::operator[](&local_1ac,local_1f8);
              pfVar10 = vec<6U,_float>::operator[](prVar9,local_1fc);
              *pfVar10 = *pfVar10 / fVar15;
              prVar9 = matrix<6U,_6U,_float>::operator[](&local_1ac,local_1f8);
              pfVar10 = vec<6U,_float>::operator[](prVar9,local_1fc);
              fVar15 = *pfVar10;
              prVar9 = matrix<6U,_6U,_float>::operator[](&local_1ac,local_1fc);
              pfVar10 = vec<6U,_float>::operator[](prVar9,local_1f8);
              *pfVar10 = fVar15;
            }
          }
          vec<6U,_float>::vec(&in_stack_fffffffffffffae0->m_centroid,
                              (float)((ulong)in_stack_fffffffffffffad8 >> 0x20));
          for (local_218 = 0; local_218 < 10; local_218 = local_218 + 1) {
            vec<6U,_float>::vec(&local_230);
            local_238 = 0.0;
            for (local_23c = 0; local_23c < 6; local_23c = local_23c + 1) {
              local_248 = 0.0;
              for (local_24c = 0; local_24c < 6; local_24c = local_24c + 1) {
                pfVar10 = vec<6U,_float>::operator[](&local_214,local_24c);
                fVar15 = *pfVar10;
                prVar9 = matrix<6U,_6U,_float>::operator[](&local_1ac,local_23c);
                pfVar10 = vec<6U,_float>::operator[](prVar9,local_24c);
                local_248 = (double)(fVar15 * *pfVar10) + local_248;
              }
              fVar15 = (float)local_248;
              pfVar10 = vec<6U,_float>::operator[](&local_230,local_23c);
              *pfVar10 = fVar15;
              if (local_23c == 0) {
                local_4a0 = local_248;
              }
              else {
                local_4a0 = math::maximum<double>(local_238,local_248);
              }
              local_238 = local_4a0;
            }
            if ((local_238 != 0.0) || (NAN(local_238))) {
              vec<6U,_float>::operator*=(&local_230,(float)(1.0 / local_238));
            }
            vec<6U,_float>::operator=(&local_214,&local_230);
          }
          vec<6U,_float>::normalize(in_stack_fffffffffffffaf0->m_rows,in_stack_fffffffffffffae8);
          vec<6U,_float>::vec(&in_stack_fffffffffffffae0->m_centroid,
                              (float)((ulong)in_stack_fffffffffffffad8 >> 0x20));
          vec<6U,_float>::vec(&in_stack_fffffffffffffae0->m_centroid,
                              (float)((ulong)in_stack_fffffffffffffad8 >> 0x20));
          local_288 = 0.0;
          local_290 = 0.0;
          for (local_294 = local_30->m_begin; local_294 < local_30->m_end; local_294 = local_294 + 1
              ) {
            local_2a0 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::
                        operator[]((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>
                                    *)(in_RDI + 5),local_294);
            local_2a4 = (float)local_2a0->weight;
            crnlib::operator-((vec<6U,_float> *)
                              CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                              in_stack_fffffffffffffaf0->m_rows);
            fVar15 = crnlib::operator*(&local_2c8,&local_214);
            local_2b0 = (double)fVar15;
            if (0.0 <= local_2b0) {
              pvVar11 = vector<crnlib::vec<6U,_float>_>::operator[]
                                  ((vector<crnlib::vec<6U,_float>_> *)(in_RDI + 1),local_2a0->index)
              ;
              vec<6U,_float>::operator+=(&local_27c,pvVar11);
              local_290 = (double)local_2a4 + local_290;
            }
            else {
              pvVar11 = vector<crnlib::vec<6U,_float>_>::operator[]
                                  ((vector<crnlib::vec<6U,_float>_> *)(in_RDI + 1),local_2a0->index)
              ;
              vec<6U,_float>::operator+=(&local_264,pvVar11);
              local_288 = (double)local_2a4 + local_288;
            }
          }
          if ((0.0 < local_288) && (0.0 < local_290)) {
            crnlib::operator*(in_stack_fffffffffffffae8,
                              (float)((ulong)in_stack_fffffffffffffae0 >> 0x20));
            vec<6U,_float>::operator=(&local_d0,&local_2e0);
            crnlib::operator*(in_stack_fffffffffffffae8,
                              (float)((ulong)in_stack_fffffffffffffae0 >> 0x20));
            vec<6U,_float>::operator=(local_100,&local_2f8);
          }
        }
        local_300 = 0;
        local_308 = 0;
        local_30c = 0;
        local_310 = 0;
        local_314 = 1e+10;
        local_318 = 0.0;
        local_31c = 0.0;
        local_320 = 0x400;
        for (local_324 = 0; local_324 < 0x400; local_324 = local_324 + 1) {
          local_310 = local_30->m_begin;
          local_30c = local_310;
          vec<6U,_float>::vec(&in_stack_fffffffffffffae0->m_centroid,
                              (eClear)((ulong)in_stack_fffffffffffffad8 >> 0x20));
          vec<6U,_float>::vec(&in_stack_fffffffffffffae0->m_centroid,
                              (eClear)((ulong)in_stack_fffffffffffffad8 >> 0x20));
          local_360 = 0.0;
          local_368 = 0.0;
          local_300 = 0;
          local_308 = 0;
          if (local_48 < 2) {
            for (local_3b4 = local_30->m_begin; local_3b4 < local_30->m_end;
                local_3b4 = local_3b4 + 1) {
              local_3c0 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::
                          operator[]((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>
                                      *)(in_RDI + 5),local_3b4);
              fVar15 = vec<6U,_float>::squared_distance
                                 (&local_d0,
                                  (vec<6U,_float> *)(*in_RDI + (ulong)local_3c0->index * 0x18));
              local_3c8 = (double)fVar15;
              fVar15 = vec<6U,_float>::squared_distance
                                 (local_100,
                                  (vec<6U,_float> *)(*in_RDI + (ulong)local_3c0->index * 0x18));
              local_3d0 = (double)fVar15;
              if (local_3d0 <= local_3c8) {
                pvVar11 = vector<crnlib::vec<6U,_float>_>::operator[]
                                    ((vector<crnlib::vec<6U,_float>_> *)(in_RDI + 1),
                                     local_3c0->index);
                vec<6U,_float>::operator+=(&local_354,pvVar11);
                pdVar13 = vector<double>::operator[]
                                    ((vector<double> *)(in_RDI + 3),local_3c0->index);
                uVar5 = local_310;
                pVVar8 = local_3c0;
                local_368 = *pdVar13 + local_368;
                local_308 = local_3c0->weight + local_308;
                local_310 = local_310 + 1;
                pVVar14 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::
                          operator[]((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>
                                      *)(in_RDI + 9),uVar5);
                *pVVar14 = *pVVar8;
              }
              else {
                pvVar11 = vector<crnlib::vec<6U,_float>_>::operator[]
                                    ((vector<crnlib::vec<6U,_float>_> *)(in_RDI + 1),
                                     local_3c0->index);
                vec<6U,_float>::operator+=(&local_33c,pvVar11);
                pdVar13 = vector<double>::operator[]
                                    ((vector<double> *)(in_RDI + 3),local_3c0->index);
                uVar5 = local_30c;
                pVVar8 = local_3c0;
                local_360 = *pdVar13 + local_360;
                local_300 = local_3c0->weight + local_300;
                local_30c = local_30c + 1;
                pVVar14 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::
                          operator[]((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>
                                      *)(in_RDI + 7),uVar5);
                *pVVar14 = *pVVar8;
              }
            }
          }
          else {
            local_388 = &local_d0;
            local_380 = local_100;
            local_378 = local_30->m_begin;
            local_374 = local_30->m_end;
            local_370 = local_48;
            for (local_38c = 0; local_38c < local_370; local_38c = local_38c + 1) {
              local_3a0 = distance_comparison_task;
              local_398 = 0;
              task_pool::
              queue_object_task<crnlib::tree_clusterizer<crnlib::vec<6u,float>>,void(crnlib::tree_clusterizer<crnlib::vec<6u,float>>::*)(unsigned_long_long,void*)>
                        ((task_pool *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                         (tree_clusterizer<crnlib::vec<6U,_float>_> *)
                         CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         in_stack_fffffffffffffaf0);
            }
            task_pool::join((task_pool *)
                            CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
            for (local_3a4 = local_30->m_begin; local_3a4 < local_30->m_end;
                local_3a4 = local_3a4 + 1) {
              local_3b0 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::
                          operator[]((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>
                                      *)(in_RDI + 5),local_3a4);
              pbVar12 = vector<bool>::operator[]((vector<bool> *)(in_RDI + 0xb),local_3a4);
              if ((*pbVar12 & 1U) == 0) {
                pvVar11 = vector<crnlib::vec<6U,_float>_>::operator[]
                                    ((vector<crnlib::vec<6U,_float>_> *)(in_RDI + 1),
                                     local_3b0->index);
                vec<6U,_float>::operator+=(&local_354,pvVar11);
                pdVar13 = vector<double>::operator[]
                                    ((vector<double> *)(in_RDI + 3),local_3b0->index);
                uVar5 = local_310;
                pVVar8 = local_3b0;
                local_368 = *pdVar13 + local_368;
                local_308 = local_3b0->weight + local_308;
                local_310 = local_310 + 1;
                pVVar14 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::
                          operator[]((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>
                                      *)(in_RDI + 9),uVar5);
                *pVVar14 = *pVVar8;
              }
              else {
                pvVar11 = vector<crnlib::vec<6U,_float>_>::operator[]
                                    ((vector<crnlib::vec<6U,_float>_> *)(in_RDI + 1),
                                     local_3b0->index);
                vec<6U,_float>::operator+=(&local_33c,pvVar11);
                pdVar13 = vector<double>::operator[]
                                    ((vector<double> *)(in_RDI + 3),local_3b0->index);
                uVar5 = local_30c;
                pVVar8 = local_3b0;
                local_360 = *pdVar13 + local_360;
                local_300 = local_3b0->weight + local_300;
                local_30c = local_30c + 1;
                pVVar14 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::
                          operator[]((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>
                                      *)(in_RDI + 7),uVar5);
                *pVVar14 = *pVVar8;
              }
            }
          }
          dVar3 = local_360;
          if ((local_300 == 0) || (local_308 == 0)) {
            local_30->m_unsplittable = true;
            return true;
          }
          fVar15 = vec<6U,_float>::dot(&in_stack_fffffffffffffae0->m_centroid,
                                       &in_stack_fffffffffffffad8->m_centroid);
          dVar2 = local_368;
          local_4c4 = (float)local_300;
          local_318 = (float)(dVar3 - (double)(fVar15 / local_4c4));
          in_stack_fffffffffffffb14 =
               vec<6U,_float>::dot(&in_stack_fffffffffffffae0->m_centroid,
                                   &in_stack_fffffffffffffad8->m_centroid);
          in_stack_fffffffffffffb18 = (float)(long)local_308;
          in_stack_fffffffffffffb1c = (float)local_308;
          local_31c = (float)(dVar2 - (double)(in_stack_fffffffffffffb14 / in_stack_fffffffffffffb1c
                                              ));
          in_stack_fffffffffffffb00 = (float)(long)local_300;
          in_stack_fffffffffffffb04 = (float)local_300;
          vec<6U,_float>::operator*=(&local_33c,1.0 / in_stack_fffffffffffffb04);
          in_stack_fffffffffffffaf8 = (float)(long)local_308;
          in_stack_fffffffffffffafc = (float)local_308;
          vec<6U,_float>::operator*=(&local_354,1.0 / in_stack_fffffffffffffafc);
          vec<6U,_float>::operator=(&local_d0,&local_33c);
          vec<6U,_float>::operator=(local_100,&local_354);
          local_3d4 = local_318 + local_31c;
          if ((local_3d4 < 1e-05) || ((local_314 - local_3d4) / local_3d4 < 1e-05)) break;
          local_314 = local_3d4;
        }
        uVar5 = *local_20;
        *local_20 = uVar5 + 1;
        local_30->m_left = uVar5;
        uVar5 = *local_20;
        *local_20 = uVar5 + 1;
        local_30->m_right = uVar5;
        NodeInfo::NodeInfo(&local_3dc,local_30->m_left,local_318);
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
        ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
               (value_type *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        NodeInfo::NodeInfo(&local_3e4,local_30->m_right,local_31c);
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
        ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
               (value_type *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        pvVar7 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                           ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                            (in_RDI + 0x11),local_30->m_left);
        this_00 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                            ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                             (in_RDI + 0x11),local_30->m_right);
        pvVar7->m_begin = local_30->m_begin;
        this_00->m_begin = local_30c;
        pvVar7->m_end = local_30c;
        this_00->m_end = local_30->m_end;
        pVVar8 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                           ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *
                            )(in_RDI + 5),pvVar7->m_begin);
        pVVar14 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                            ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>
                              *)(in_RDI + 7),local_30->m_begin);
        memcpy(pVVar8,pVVar14,(ulong)(pvVar7->m_end - pvVar7->m_begin) << 3);
        pVVar8 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                           ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *
                            )(in_RDI + 5),this_00->m_begin);
        pVVar14 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                            ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>
                              *)(in_RDI + 9),local_30->m_begin);
        memcpy(pVVar8,pVVar14,(ulong)(this_00->m_end - this_00->m_begin) << 3);
        vec<6U,_float>::operator=(&pvVar7->m_centroid,&local_d0);
        pvVar7->m_total_weight = local_300;
        pvVar7->m_variance = local_318;
        vec<6U,_float>::operator=(&this_00->m_centroid,local_100);
        this_00->m_total_weight = local_308;
        this_00->m_variance = local_31c;
        local_1 = true;
      }
      else {
        if ((local_30->m_unsplittable & 1U) == 0) {
          vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                    ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                     (in_RDI + 0x11),local_30->m_left);
          vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                    ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                     (in_RDI + 0x11),*local_20);
          vq_node::operator=(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
          pvVar7 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                             ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                              (in_RDI + 0x11),*local_20);
          pvVar7->m_alternative = true;
          uVar5 = *local_20;
          pvVar7 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                             ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                              (in_RDI + 0x11),*local_20);
          NodeInfo::NodeInfo(&local_38,uVar5,pvVar7->m_variance);
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                  *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (value_type *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          uVar5 = *local_20;
          *local_20 = uVar5 + 1;
          local_30->m_left = uVar5;
          vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                    ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                     (in_RDI + 0x11),local_30->m_right);
          vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                    ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                     (in_RDI + 0x11),*local_20);
          vq_node::operator=(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
          pvVar7 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                             ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                              (in_RDI + 0x11),*local_20);
          pvVar7->m_alternative = true;
          uVar5 = *local_20;
          pvVar7 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                             ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                              (in_RDI + 0x11),*local_20);
          NodeInfo::NodeInfo(&local_40,uVar5,pvVar7->m_variance);
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                  *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (value_type *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          uVar5 = *local_20;
          *local_20 = uVar5 + 1;
          local_30->m_right = uVar5;
        }
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool split_node(std::priority_queue<NodeInfo>& node_queue, uint& end_node, task_pool* pTask_pool = 0) {
    if (node_queue.empty())
      return false;

    vq_node& parent_node = m_nodes[node_queue.top().m_index];

    if (parent_node.m_alternative)
      parent_node.m_alternative = false;

    if (parent_node.m_variance <= 0.0f || parent_node.m_begin + 1 == parent_node.m_end)
      return false;

    node_queue.pop();

    if (parent_node.m_processed) {
      if (!parent_node.m_unsplittable) {
        m_nodes[end_node] = m_nodes[parent_node.m_left];
        m_nodes[end_node].m_alternative = true;
        node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
        parent_node.m_left = end_node++;
        m_nodes[end_node] = m_nodes[parent_node.m_right];
        m_nodes[end_node].m_alternative = true;
        node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
        parent_node.m_right = end_node++;
      }
      return true;
    }
    parent_node.m_processed = true;

    uint num_blocks = (parent_node.m_end - parent_node.m_begin) >> 9;
    uint num_tasks = num_blocks > 1 && pTask_pool ? math::minimum(num_blocks, pTask_pool->get_num_threads() + 1) : 1;

    VectorType furthest(0);
    double furthest_dist = -1.0f;

    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double dist = v.squared_distance(parent_node.m_centroid);
      if (dist > furthest_dist) {
        furthest_dist = dist;
        furthest = v;
      }
    }

    VectorType opposite;
    double opposite_dist = -1.0f;

    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double dist = v.squared_distance(furthest);
      if (dist > opposite_dist) {
        opposite_dist = dist;
        opposite = v;
      }
    }

    VectorType left_child((furthest + parent_node.m_centroid) * .5f);
    VectorType right_child((opposite + parent_node.m_centroid) * .5f);

    if (parent_node.m_begin + 2 < parent_node.m_end) {
      const uint N = VectorType::num_elements;

      matrix<N, N, float> covar;
      covar.clear();

      for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
        const VectorType& v = m_vectors[m_vectorsInfo[i].index] - parent_node.m_centroid;
        const VectorType w = v * (float)m_vectorsInfo[i].weight;
        for (uint x = 0; x < N; x++) {
          for (uint y = x; y < N; y++)
            covar[x][y] = covar[x][y] + v[x] * w[y];
        }
      }

      float divider = (float)parent_node.m_total_weight;
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++) {
          covar[x][y] /= divider;
          covar[y][x] = covar[x][y];
        }
      }

      VectorType axis(1.0f);
      // Starting with an estimate of the principle axis should work better, but doesn't in practice?
      //left_child - right_child);
      //axis.normalize();

      for (uint iter = 0; iter < 10; iter++) {
        VectorType x;

        double max_sum = 0;

        for (uint i = 0; i < N; i++) {
          double sum = 0;

          for (uint j = 0; j < N; j++)
            sum += axis[j] * covar[i][j];

          x[i] = (float)sum;

          max_sum = i ? math::maximum(max_sum, sum) : sum;
        }

        if (max_sum != 0.0f)
          x *= (float)(1.0f / max_sum);

        axis = x;
      }

      axis.normalize();

      VectorType new_left_child(0.0f);
      VectorType new_right_child(0.0f);

      double left_weight = 0.0f;
      double right_weight = 0.0f;

      for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
        const VectorInfo& vectorInfo = m_vectorsInfo[i];
        const float weight = (float)vectorInfo.weight;
        double t = (m_vectors[vectorInfo.index] - parent_node.m_centroid) * axis;
        if (t < 0.0f) {
          new_left_child += m_weightedVectors[vectorInfo.index];
          left_weight += weight;
        } else {
          new_right_child += m_weightedVectors[vectorInfo.index];
          right_weight += weight;
        }
      }

      if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
        left_child = new_left_child * (float)(1.0f / left_weight);
        right_child = new_right_child * (float)(1.0f / right_weight);
      }
    }

    uint64 left_weight = 0;
    uint64 right_weight = 0;

    uint left_info_index = 0;
    uint right_info_index = 0;

    float prev_total_variance = 1e+10f;

    float left_variance = 0.0f;
    float right_variance = 0.0f;

    // FIXME: Excessive upper limit
    const uint cMaxLoops = 1024;
    for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
      left_info_index = right_info_index = parent_node.m_begin;

      VectorType new_left_child(cClear);
      VectorType new_right_child(cClear);

      double left_ttsum = 0.0f;
      double right_ttsum = 0.0f;

      left_weight = 0;
      right_weight = 0;

      if (num_tasks > 1) {
        distance_comparison_task_params params;
        params.left_child = &left_child;
        params.right_child = &right_child;
        params.begin = parent_node.m_begin;
        params.end = parent_node.m_end;
        params.num_tasks = num_tasks;

        for (uint task = 0; task < params.num_tasks; task++)
          pTask_pool->queue_object_task(this, &tree_clusterizer::distance_comparison_task, task, &params);
        pTask_pool->join();

        for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
          const VectorInfo& vectorInfo = m_vectorsInfo[i];
          if (m_vectorComparison[i]) {
            new_left_child += m_weightedVectors[vectorInfo.index];
            left_ttsum += m_weightedDotProducts[vectorInfo.index];
            left_weight += vectorInfo.weight;
            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
          } else {
            new_right_child += m_weightedVectors[vectorInfo.index];
            right_ttsum += m_weightedDotProducts[vectorInfo.index];
            right_weight += vectorInfo.weight;
            m_vectorsInfoRight[right_info_index++] = vectorInfo;
          }
        }
      } else {
        for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
          const VectorInfo& vectorInfo = m_vectorsInfo[i];
          double left_dist2 = left_child.squared_distance(m_vectors[vectorInfo.index]);
          double right_dist2 = right_child.squared_distance(m_vectors[vectorInfo.index]);
          if (left_dist2 < right_dist2) {
            new_left_child += m_weightedVectors[vectorInfo.index];
            left_ttsum += m_weightedDotProducts[vectorInfo.index];
            left_weight += vectorInfo.weight;
            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
          } else {
            new_right_child += m_weightedVectors[vectorInfo.index];
            right_ttsum += m_weightedDotProducts[vectorInfo.index];
            right_weight += vectorInfo.weight;
            m_vectorsInfoRight[right_info_index++] = vectorInfo;
          }
        }
      }

      if ((!left_weight) || (!right_weight)) {
        parent_node.m_unsplittable = true;
        return true;
      }

      left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
      right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));

      new_left_child *= (1.0f / left_weight);
      new_right_child *= (1.0f / right_weight);

      left_child = new_left_child;
      right_child = new_right_child;

      float total_variance = left_variance + right_variance;
      if (total_variance < .00001f)
        break;

      if (((prev_total_variance - total_variance) / total_variance) < .00001f)
        break;

      prev_total_variance = total_variance;
    }

    parent_node.m_left = end_node++;
    parent_node.m_right = end_node++;

    node_queue.push(NodeInfo(parent_node.m_left, left_variance));
    node_queue.push(NodeInfo(parent_node.m_right, right_variance));

    vq_node& left_child_node = m_nodes[parent_node.m_left];
    vq_node& right_child_node = m_nodes[parent_node.m_right];

    left_child_node.m_begin = parent_node.m_begin;
    left_child_node.m_end = right_child_node.m_begin = left_info_index;
    right_child_node.m_end = parent_node.m_end;

    memcpy(&m_vectorsInfo[left_child_node.m_begin], &m_vectorsInfoLeft[parent_node.m_begin], (left_child_node.m_end - left_child_node.m_begin) * sizeof(VectorInfo));
    memcpy(&m_vectorsInfo[right_child_node.m_begin], &m_vectorsInfoRight[parent_node.m_begin], (right_child_node.m_end - right_child_node.m_begin) * sizeof(VectorInfo));

    left_child_node.m_centroid = left_child;
    left_child_node.m_total_weight = left_weight;
    left_child_node.m_variance = left_variance;

    right_child_node.m_centroid = right_child;
    right_child_node.m_total_weight = right_weight;
    right_child_node.m_variance = right_variance;

    return true;
  }